

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::objectStreams(Config *this,string *parameter)

{
  bool bVar1;
  allocator<char> local_31;
  string local_30;
  
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  object_stream_set = true;
  bVar1 = std::operator==(parameter,"disable");
  if (bVar1) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    object_stream_mode = qpdf_o_disable;
  }
  else {
    bVar1 = std::operator==(parameter,"preserve");
    if (bVar1) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      object_stream_mode = qpdf_o_preserve;
    }
    else {
      bVar1 = std::operator==(parameter,"generate");
      if (bVar1) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        object_stream_mode = qpdf_o_generate;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"invalid object stream mode",&local_31);
        usage(&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::objectStreams(std::string const& parameter)
{
    o.m->object_stream_set = true;
    if (parameter == "disable") {
        o.m->object_stream_mode = qpdf_o_disable;
    } else if (parameter == "preserve") {
        o.m->object_stream_mode = qpdf_o_preserve;
    } else if (parameter == "generate") {
        o.m->object_stream_mode = qpdf_o_generate;
    } else {
        usage("invalid object stream mode");
    }
    return this;
}